

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

Element __thiscall ftxui::TabContainer::Render(TabContainer *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  Element EVar1;
  Component active_child;
  allocator<char> local_41;
  long *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  string local_30 [32];
  
  (**(code **)(*in_RSI + 0x20))(&local_40);
  if (local_40 == (long *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"Empty container",&local_41);
    text((string *)this);
    std::__cxx11::string::~string(local_30);
  }
  else {
    (**(code **)(*local_40 + 0x10))(this);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    Component active_child = ActiveChild();
    if (active_child)
      return active_child->Render();
    return text("Empty container");
  }